

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O0

void __thiscall tt::LogFile::LogFile(LogFile *this,string *basename,int flushEveryN)

{
  MutexLock *this_00;
  AppendFile *this_01;
  string local_50 [52];
  int local_1c;
  string *psStack_18;
  int flushEveryN_local;
  string *basename_local;
  LogFile *this_local;
  
  local_1c = flushEveryN;
  psStack_18 = basename;
  basename_local = &this->m_basename;
  std::__cxx11::string::string((string *)this,(string *)basename);
  this->m_flushEveryN = local_1c;
  this->m_count = 0;
  this_00 = (MutexLock *)operator_new(0x30);
  MutexLock::MutexLock(this_00);
  std::unique_ptr<tt::MutexLock,std::default_delete<tt::MutexLock>>::
  unique_ptr<std::default_delete<tt::MutexLock>,void>
            ((unique_ptr<tt::MutexLock,std::default_delete<tt::MutexLock>> *)&this->m_mutex,this_00)
  ;
  std::unique_ptr<tt::FileUtil::AppendFile,std::default_delete<tt::FileUtil::AppendFile>>::
  unique_ptr<std::default_delete<tt::FileUtil::AppendFile>,void>
            ((unique_ptr<tt::FileUtil::AppendFile,std::default_delete<tt::FileUtil::AppendFile>> *)
             &this->m_file);
  this_01 = (AppendFile *)operator_new(0x10008);
  std::__cxx11::string::string(local_50,(string *)psStack_18);
  FileUtil::AppendFile::AppendFile(this_01,(string *)local_50);
  std::unique_ptr<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>::reset
            (&this->m_file,this_01);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

tt::LogFile::LogFile(const std::string& basename, int flushEveryN)
	:m_basename(basename),
	m_flushEveryN(flushEveryN),
	m_count(0),
	m_mutex(new MutexLock){
	
	m_file.reset(new FileUtil::AppendFile(basename));	
}